

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  int *piVar1;
  ImGuiViewportP *pIVar2;
  ImGuiWindow *window_00;
  int iVar3;
  long lVar4;
  
  if (0 < (GImGui->Viewports).Size) {
    pIVar2 = *(GImGui->Viewports).Data;
    piVar1 = &(GImGui->IO).MetricsRenderWindows;
    *piVar1 = *piVar1 + 1;
    AddDrawListToDrawData((pIVar2->DrawDataBuilder).Layers + (uint)layer,window->DrawList);
    iVar3 = (window->DC).ChildWindows.Size;
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        window_00 = (window->DC).ChildWindows.Data[lVar4];
        if ((window_00->Active == true) && (window_00->Hidden == false)) {
          AddWindowToDrawData(window_00,layer);
          iVar3 = (window->DC).ChildWindows.Size;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    return;
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,"T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]");
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
    }
}